

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O1

int testStorageReaderTestsIncorrectMetadata(void)

{
  pointer pcVar1;
  string *this;
  string *psVar2;
  ostream *poVar3;
  initializer_list<unsigned_short> __l;
  Span<unsigned_short,_18446744073709551615UL> data;
  vector<unsigned_short,_std::allocator<unsigned_short>_> bytes;
  AutoDeleteTempFile tempfile;
  StorageReader reader;
  allocator_type local_109;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_108;
  string local_f0;
  AutoDeleteTempFile local_d0;
  StorageReader local_a8 [17];
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_d0);
  memcpy(local_a8,&DAT_003bc49a,0x88);
  __l._M_len = 0x44;
  __l._M_array = (iterator)local_a8;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_108,__l,&local_109);
  this = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_d0);
  psVar2 = (string *)0x0;
  if ((long)local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    psVar2 = (string *)
             local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  data.m_ptr = (pointer)((long)local_108.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_108.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 1);
  data.m_size.m_size =
       (size_t)local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_start;
  MILBlob::TestUtil::WriteBlobFile<unsigned_short,18446744073709551615ul>
            ((TestUtil *)this,psVar2,data);
  if ((string *)
      local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (string *)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_d0);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + psVar2->_M_string_length);
  MILBlob::Blob::StorageReader::StorageReader(local_a8,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  MILBlob::Blob::StorageReader::GetDataView<unsigned_char>(local_a8,0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
             ,0x72);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0xda);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,": expected exception, but none thrown.\n",0x27);
  MILBlob::Blob::StorageReader::~StorageReader(local_a8);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_d0);
  return 1;
}

Assistant:

int testStorageReaderTestsIncorrectMetadata()
{
    AutoDeleteTempFile tempfile;

    {
        // clang-format off
        std::vector<uint16_t> bytes {
            // HEADER
            0x0001, 0x0000, 0x0002, 0x0000,  // count=1, version=2
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_0
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_1
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_2
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_3
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_4
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_5
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_6
            // METADATA
            0xBEEF, 0xDEAD, 0x000E, 0x0000,  // sentinel=0xDEADBEEF, mil_dtype=uint8_t
            0x0008, 0x0000, 0x0000, 0x0000,  // sizeInBytes=8 bytes
            0x0060, 0x0000, 0x0000, 0x0000,  // offset
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_0
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_1
            0x0001, 0x0000, 0x0000, 0x0000,  // reserved_2
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_3
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_4
            // DATA (8 bytes)
            0x0000, 0x0000, 0x0000, 0x0000
        };
        // clang-format on

        TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::MakeSpan(bytes));
    }

    StorageReader reader(tempfile.GetFilename());
    ML_ASSERT_THROWS_WITH_MESSAGE(reader.GetDataView<uint8_t>(0),
                                  std::runtime_error,
                                  "Invalid sentinel in blob_metadata.");

    return 0;
}